

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O1

void buf_grow(SBuf *sb,MSize sz)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  void *pvVar5;
  uint nsz;
  uint osz;
  
  uVar1 = (sb->p).ptr32;
  uVar2 = (sb->b).ptr32;
  osz = (sb->e).ptr32 - uVar2;
  uVar3 = 0x20;
  if (0x20 < osz) {
    uVar3 = osz;
  }
  do {
    nsz = uVar3;
    uVar3 = nsz * 2;
  } while (nsz < sz);
  pvVar5 = lj_mem_realloc((lua_State *)(ulong)(sb->L).ptr32,(void *)(ulong)uVar2,osz,nsz);
  uVar4 = (uint32_t)pvVar5;
  (sb->b).ptr32 = uVar4;
  (sb->p).ptr32 = (uVar1 - uVar2) + uVar4;
  (sb->e).ptr32 = uVar4 + nsz;
  return;
}

Assistant:

static void buf_grow(SBuf *sb, MSize sz)
{
  MSize osz = sbufsz(sb), len = sbuflen(sb), nsz = osz;
  char *b;
  if (nsz < LJ_MIN_SBUF) nsz = LJ_MIN_SBUF;
  while (nsz < sz) nsz += nsz;
  b = (char *)lj_mem_realloc(sbufL(sb), sbufB(sb), osz, nsz);
  setmref(sb->b, b);
  setmref(sb->p, b + len);
  setmref(sb->e, b + nsz);
}